

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void wasm::PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::scan
               (InitScanner *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  If *pIVar2;
  Loop *pLVar3;
  Break *pBVar4;
  Switch *pSVar5;
  Call *pCVar6;
  CallIndirect *pCVar7;
  LocalSet *pLVar8;
  GlobalSet *pGVar9;
  Load *pLVar10;
  Store *pSVar11;
  AtomicRMW *pAVar12;
  AtomicCmpxchg *pAVar13;
  AtomicWait *pAVar14;
  AtomicNotify *pAVar15;
  SIMDExtract *pSVar16;
  SIMDReplace *pSVar17;
  SIMDShuffle *pSVar18;
  size_type sVar19;
  SIMDTernary *pSVar20;
  SIMDShift *pSVar21;
  SIMDLoad *pSVar22;
  SIMDLoadStoreLane *pSVar23;
  MemoryInit *pMVar24;
  MemoryCopy *pMVar25;
  MemoryFill *pMVar26;
  Unary *pUVar27;
  Binary *pBVar28;
  Select *pSVar29;
  Drop *pDVar30;
  Return *pRVar31;
  MemoryGrow *pMVar32;
  RefIsNull *pRVar33;
  RefEq *pRVar34;
  TableGet *pTVar35;
  TableSet *pTVar36;
  TableGrow *pTVar37;
  TableFill *pTVar38;
  TableCopy *pTVar39;
  TableInit *pTVar40;
  Try *pTVar41;
  TryTable *pTVar42;
  Throw *pTVar43;
  ThrowRef *pTVar44;
  TupleMake *pTVar45;
  TupleExtract *pTVar46;
  RefI31 *pRVar47;
  I31Get *pIVar48;
  CallRef *pCVar49;
  RefTest *pRVar50;
  RefCast *pRVar51;
  BrOn *pBVar52;
  StructNew *pSVar53;
  StructGet *pSVar54;
  StructSet *pSVar55;
  StructRMW *pSVar56;
  StructCmpxchg *pSVar57;
  ArrayNew *pAVar58;
  ArrayNewData *pAVar59;
  ArrayNewElem *pAVar60;
  ArrayNewFixed *pAVar61;
  ArrayGet *pAVar62;
  ArraySet *pAVar63;
  ArrayLen *pAVar64;
  ArrayCopy *pAVar65;
  ArrayFill *pAVar66;
  ArrayInitData *pAVar67;
  ArrayInitElem *pAVar68;
  RefAs *pRVar69;
  StringNew *pSVar70;
  StringMeasure *pSVar71;
  StringEncode *pSVar72;
  StringConcat *pSVar73;
  StringEq *pSVar74;
  StringWTF16Get *pSVar75;
  StringSliceWTF *pSVar76;
  ContNew *pCVar77;
  ContBind *pCVar78;
  Suspend *pSVar79;
  Resume *pRVar80;
  ResumeThrow *pRVar81;
  StackSwitch *pSVar82;
  size_t sVar83;
  Expression **ppEVar84;
  int local_3b4;
  int i_26;
  StackSwitch *cast_94;
  Index i_25;
  Index i_24;
  int i_23;
  Index i_22;
  ResumeThrow *cast_93;
  Index i_21;
  Index i_20;
  int i_19;
  Index i_18;
  Resume *cast_92;
  int i_17;
  Suspend *cast_91;
  int i_16;
  ContBind *cast_90;
  ContNew *cast_89;
  StringSliceWTF *cast_88;
  StringWTF16Get *cast_87;
  StringEq *cast_86;
  StringConcat *cast_85;
  StringEncode *cast_84;
  StringMeasure *cast_83;
  StringConst *cast_82;
  StringNew *cast_81;
  RefAs *cast_80;
  ArrayInitElem *cast_79;
  ArrayInitData *cast_78;
  ArrayFill *cast_77;
  ArrayCopy *cast_76;
  ArrayLen *cast_75;
  ArraySet *cast_74;
  ArrayGet *cast_73;
  int i_15;
  ArrayNewFixed *cast_72;
  ArrayNewElem *cast_71;
  ArrayNewData *cast_70;
  ArrayNew *cast_69;
  StructCmpxchg *cast_68;
  StructRMW *cast_67;
  StructSet *cast_66;
  StructGet *cast_65;
  int i_14;
  StructNew *cast_64;
  BrOn *cast_63;
  RefCast *cast_62;
  RefTest *cast_61;
  int i_13;
  CallRef *cast_60;
  I31Get *cast_59;
  RefI31 *cast_58;
  TupleExtract *cast_57;
  int i_12;
  TupleMake *cast_56;
  Pop *cast_55;
  Unreachable *cast_54;
  Nop *cast_53;
  ThrowRef *cast_52;
  Rethrow *cast_51;
  int i_11;
  Throw *cast_50;
  Index i_10;
  Index i_9;
  Index i_8;
  Index i_7;
  TryTable *cast_49;
  Index i_6;
  int i_5;
  Try *cast_48;
  TableInit *cast_47;
  TableCopy *cast_46;
  TableFill *cast_45;
  TableGrow *cast_44;
  TableSize *cast_43;
  TableSet *cast_42;
  TableGet *cast_41;
  RefEq *cast_40;
  RefFunc *cast_39;
  RefIsNull *cast_38;
  RefNull *cast_37;
  MemoryGrow *cast_36;
  MemorySize *cast_35;
  Return *cast_34;
  Drop *cast_33;
  Select *cast_32;
  Binary *cast_31;
  Unary *cast_30;
  Const *cast_29;
  MemoryFill *cast_28;
  MemoryCopy *cast_27;
  DataDrop *cast_26;
  MemoryInit *cast_25;
  SIMDLoadStoreLane *cast_24;
  SIMDLoad *cast_23;
  SIMDShift *cast_22;
  SIMDTernary *cast_21;
  Index i_4;
  SIMDShuffle *cast_20;
  SIMDReplace *cast_19;
  SIMDExtract *cast_18;
  AtomicFence *cast_17;
  AtomicNotify *cast_16;
  AtomicWait *cast_15;
  AtomicCmpxchg *cast_14;
  AtomicRMW *cast_13;
  Store *cast_12;
  Load *cast_11;
  GlobalSet *cast_10;
  GlobalGet *cast_9;
  LocalSet *cast_8;
  LocalGet *cast_7;
  int i_3;
  CallIndirect *cast_6;
  int i_2;
  Call *cast_5;
  Index i_1;
  Switch *cast_4;
  Break *cast_3;
  Loop *cast_2;
  If *cast_1;
  int i;
  Block *cast;
  Expression *curr;
  Expression **currp_local;
  InitScanner *self_local;
  
  this = *currp;
  switch(*this) {
  case (Expression)0x0:
  case (Expression)0x60:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  case (Expression)0x1:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pBVar1 + 0x20));
    cast_1._4_4_ = (int)sVar83;
    while (cast_1._4_4_ = cast_1._4_4_ + -1, -1 < cast_1._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pBVar1 + 0x20),(long)cast_1._4_4_);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar84);
    }
    break;
  case (Expression)0x2:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitIf,currp);
    pIVar2 = Expression::cast<wasm::If>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::maybePushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pIVar2 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pIVar2 + 0x18));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pIVar2 + 0x10));
    break;
  case (Expression)0x3:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitLoop,currp);
    pLVar3 = Expression::cast<wasm::Loop>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pLVar3 + 0x20));
    break;
  case (Expression)0x4:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitBreak,currp);
    pBVar4 = Expression::cast<wasm::Break>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::maybePushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pBVar4 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::maybePushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pBVar4 + 0x20));
    break;
  case (Expression)0x5:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSwitch,currp);
    pSVar5 = Expression::cast<wasm::Switch>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar5 + 0x48));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::maybePushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar5 + 0x40));
    for (cast_5._4_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pSVar5 + 0x10))
        , cast_5._4_4_ < sVar83; cast_5._4_4_ = cast_5._4_4_ + 1) {
    }
    break;
  case (Expression)0x6:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitCall,currp);
    pCVar6 = Expression::cast<wasm::Call>(this);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pCVar6 + 0x10));
    cast_6._4_4_ = (int)sVar83;
    while (cast_6._4_4_ = cast_6._4_4_ + -1, -1 < cast_6._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pCVar6 + 0x10),(long)cast_6._4_4_);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar84);
    }
    break;
  case (Expression)0x7:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitCallIndirect,currp);
    pCVar7 = Expression::cast<wasm::CallIndirect>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pCVar7 + 0x38));
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pCVar7 + 0x18));
    cast_7._4_4_ = (int)sVar83;
    while (cast_7._4_4_ = cast_7._4_4_ + -1, -1 < cast_7._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pCVar7 + 0x18),(long)cast_7._4_4_);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar84);
    }
    break;
  case (Expression)0x8:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitLocalGet,currp);
    Expression::cast<wasm::LocalGet>(this);
    break;
  case (Expression)0x9:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitLocalSet,currp);
    pLVar8 = Expression::cast<wasm::LocalSet>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pLVar8 + 0x18));
    break;
  case (Expression)0xa:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitGlobalGet,currp);
    Expression::cast<wasm::GlobalGet>(this);
    break;
  case (Expression)0xb:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitGlobalSet,currp);
    pGVar9 = Expression::cast<wasm::GlobalSet>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pGVar9 + 0x20));
    break;
  case (Expression)0xc:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitLoad,currp);
    pLVar10 = Expression::cast<wasm::Load>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pLVar10 + 0x30));
    break;
  case (Expression)0xd:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStore,currp);
    pSVar11 = Expression::cast<wasm::Store>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar11 + 0x38));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar11 + 0x30));
    break;
  case (Expression)0xe:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    break;
  case (Expression)0xf:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitUnary,currp);
    pUVar27 = Expression::cast<wasm::Unary>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pUVar27 + 0x18));
    break;
  case (Expression)0x10:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitBinary,currp);
    pBVar28 = Expression::cast<wasm::Binary>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pBVar28 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pBVar28 + 0x18));
    break;
  case (Expression)0x11:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSelect,currp);
    pSVar29 = Expression::cast<wasm::Select>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar29 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar29 + 0x18));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar29 + 0x10));
    break;
  case (Expression)0x12:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitDrop,currp);
    pDVar30 = Expression::cast<wasm::Drop>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pDVar30 + 0x10));
    break;
  case (Expression)0x13:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitReturn,currp);
    pRVar31 = Expression::cast<wasm::Return>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::maybePushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pRVar31 + 0x10));
    break;
  case (Expression)0x14:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitMemorySize,currp);
    Expression::cast<wasm::MemorySize>(this);
    break;
  case (Expression)0x15:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitMemoryGrow,currp);
    pMVar32 = Expression::cast<wasm::MemoryGrow>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pMVar32 + 0x10));
    break;
  case (Expression)0x16:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    break;
  case (Expression)0x17:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitUnreachable,currp);
    Expression::cast<wasm::Unreachable>(this);
    break;
  case (Expression)0x18:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitAtomicRMW,currp);
    pAVar12 = Expression::cast<wasm::AtomicRMW>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar12 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar12 + 0x20));
    break;
  case (Expression)0x19:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitAtomicCmpxchg,currp);
    pAVar13 = Expression::cast<wasm::AtomicCmpxchg>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar13 + 0x30));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar13 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar13 + 0x20));
    break;
  case (Expression)0x1a:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitAtomicWait,currp);
    pAVar14 = Expression::cast<wasm::AtomicWait>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar14 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar14 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar14 + 0x18));
    break;
  case (Expression)0x1b:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitAtomicNotify,currp);
    pAVar15 = Expression::cast<wasm::AtomicNotify>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar15 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar15 + 0x18));
    break;
  case (Expression)0x1c:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitAtomicFence,currp);
    Expression::cast<wasm::AtomicFence>(this);
    break;
  case (Expression)0x1d:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDExtract,currp);
    pSVar16 = Expression::cast<wasm::SIMDExtract>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar16 + 0x18));
    break;
  case (Expression)0x1e:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDReplace,currp);
    pSVar17 = Expression::cast<wasm::SIMDReplace>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar17 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar17 + 0x18));
    break;
  case (Expression)0x1f:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDShuffle,currp);
    pSVar18 = Expression::cast<wasm::SIMDShuffle>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar18 + 0x18));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar18 + 0x10));
    for (cast_21._4_4_ = 0;
        sVar19 = std::array<unsigned_char,_16UL>::size
                           ((array<unsigned_char,_16UL> *)(pSVar18 + 0x20)), cast_21._4_4_ < sVar19;
        cast_21._4_4_ = cast_21._4_4_ + 1) {
    }
    break;
  case (Expression)0x20:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDTernary,currp);
    pSVar20 = Expression::cast<wasm::SIMDTernary>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar20 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar20 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar20 + 0x18));
    break;
  case (Expression)0x21:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDShift,currp);
    pSVar21 = Expression::cast<wasm::SIMDShift>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar21 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar21 + 0x18));
    break;
  case (Expression)0x22:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDLoad,currp);
    pSVar22 = Expression::cast<wasm::SIMDLoad>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar22 + 0x28));
    break;
  case (Expression)0x23:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDLoadStoreLane,
               currp);
    pSVar23 = Expression::cast<wasm::SIMDLoadStoreLane>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar23 + 0x38));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar23 + 0x30));
    break;
  case (Expression)0x24:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitMemoryInit,currp);
    pMVar24 = Expression::cast<wasm::MemoryInit>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pMVar24 + 0x30));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pMVar24 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pMVar24 + 0x20));
    break;
  case (Expression)0x25:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitDataDrop,currp);
    Expression::cast<wasm::DataDrop>(this);
    break;
  case (Expression)0x26:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitMemoryCopy,currp);
    pMVar25 = Expression::cast<wasm::MemoryCopy>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pMVar25 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pMVar25 + 0x18));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pMVar25 + 0x10));
    break;
  case (Expression)0x27:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitMemoryFill,currp);
    pMVar26 = Expression::cast<wasm::MemoryFill>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pMVar26 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pMVar26 + 0x18));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pMVar26 + 0x10));
    break;
  case (Expression)0x28:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    break;
  case (Expression)0x29:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefNull,currp);
    Expression::cast<wasm::RefNull>(this);
    break;
  case (Expression)0x2a:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefIsNull,currp);
    pRVar33 = Expression::cast<wasm::RefIsNull>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pRVar33 + 0x10));
    break;
  case (Expression)0x2b:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefFunc,currp);
    Expression::cast<wasm::RefFunc>(this);
    break;
  case (Expression)0x2c:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefEq,currp);
    pRVar34 = Expression::cast<wasm::RefEq>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pRVar34 + 0x18));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pRVar34 + 0x10));
    break;
  case (Expression)0x2d:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableGet,currp);
    pTVar35 = Expression::cast<wasm::TableGet>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar35 + 0x20));
    break;
  case (Expression)0x2e:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableSet,currp);
    pTVar36 = Expression::cast<wasm::TableSet>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar36 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar36 + 0x20));
    break;
  case (Expression)0x2f:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableSize,currp);
    Expression::cast<wasm::TableSize>(this);
    break;
  case (Expression)0x30:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableGrow,currp);
    pTVar37 = Expression::cast<wasm::TableGrow>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar37 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar37 + 0x20));
    break;
  case (Expression)0x31:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableFill,currp);
    pTVar38 = Expression::cast<wasm::TableFill>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar38 + 0x30));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar38 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar38 + 0x20));
    break;
  case (Expression)0x32:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableCopy,currp);
    pTVar39 = Expression::cast<wasm::TableCopy>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar39 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar39 + 0x18));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar39 + 0x10));
    break;
  case (Expression)0x33:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableInit,currp);
    pTVar40 = Expression::cast<wasm::TableInit>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar40 + 0x30));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar40 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar40 + 0x20));
    break;
  case (Expression)0x34:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTry,currp);
    pTVar41 = Expression::cast<wasm::Try>(this);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pTVar41 + 0x48));
    cast_49._4_4_ = (int)sVar83;
    while (cast_49._4_4_ = cast_49._4_4_ + -1, -1 < cast_49._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pTVar41 + 0x48),(long)cast_49._4_4_);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar84);
    }
    for (cast_49._0_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pTVar41 + 0x28)
                           ), (uint)cast_49 < sVar83; cast_49._0_4_ = (uint)cast_49 + 1) {
    }
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar41 + 0x20));
    break;
  case (Expression)0x35:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTryTable,currp);
    pTVar42 = Expression::cast<wasm::TryTable>(this);
    for (i_9 = 0; sVar83 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                                     ((ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type> *)
                                      (pTVar42 + 0x78)), i_9 < sVar83; i_9 = i_9 + 1) {
    }
    for (i_10 = 0;
        sVar83 = ArenaVectorBase<ArenaVector<bool>,_bool>::size
                           ((ArenaVectorBase<ArenaVector<bool>,_bool> *)(pTVar42 + 0x58)),
        i_10 < sVar83; i_10 = i_10 + 1) {
    }
    for (cast_50._4_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pTVar42 + 0x38)
                           ), cast_50._4_4_ < sVar83; cast_50._4_4_ = cast_50._4_4_ + 1) {
    }
    for (cast_50._0_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pTVar42 + 0x18)
                           ), (uint)cast_50 < sVar83; cast_50._0_4_ = (uint)cast_50 + 1) {
    }
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar42 + 0x10));
    break;
  case (Expression)0x36:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitThrow,currp);
    pTVar43 = Expression::cast<wasm::Throw>(this);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pTVar43 + 0x20));
    cast_51._4_4_ = (int)sVar83;
    while (cast_51._4_4_ = cast_51._4_4_ + -1, -1 < cast_51._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pTVar43 + 0x20),(long)cast_51._4_4_);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar84);
    }
    break;
  case (Expression)0x37:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRethrow,currp);
    Expression::cast<wasm::Rethrow>(this);
    break;
  case (Expression)0x38:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitThrowRef,currp);
    pTVar44 = Expression::cast<wasm::ThrowRef>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar44 + 0x10));
    break;
  case (Expression)0x39:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTupleMake,currp);
    pTVar45 = Expression::cast<wasm::TupleMake>(this);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pTVar45 + 0x10));
    cast_57._4_4_ = (int)sVar83;
    while (cast_57._4_4_ = cast_57._4_4_ + -1, -1 < cast_57._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pTVar45 + 0x10),(long)cast_57._4_4_);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar84);
    }
    break;
  case (Expression)0x3a:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTupleExtract,currp);
    pTVar46 = Expression::cast<wasm::TupleExtract>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pTVar46 + 0x10));
    break;
  case (Expression)0x3b:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefI31,currp);
    pRVar47 = Expression::cast<wasm::RefI31>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pRVar47 + 0x10));
    break;
  case (Expression)0x3c:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitI31Get,currp);
    pIVar48 = Expression::cast<wasm::I31Get>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pIVar48 + 0x10));
    break;
  case (Expression)0x3d:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitCallRef,currp);
    pCVar49 = Expression::cast<wasm::CallRef>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pCVar49 + 0x30));
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pCVar49 + 0x10));
    cast_61._4_4_ = (int)sVar83;
    while (cast_61._4_4_ = cast_61._4_4_ + -1, -1 < cast_61._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pCVar49 + 0x10),(long)cast_61._4_4_);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar84);
    }
    break;
  case (Expression)0x3e:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefTest,currp);
    pRVar50 = Expression::cast<wasm::RefTest>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pRVar50 + 0x10));
    break;
  case (Expression)0x3f:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefCast,currp);
    pRVar51 = Expression::cast<wasm::RefCast>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pRVar51 + 0x10));
    break;
  case (Expression)0x40:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitBrOn,currp);
    pBVar52 = Expression::cast<wasm::BrOn>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pBVar52 + 0x28));
    break;
  case (Expression)0x41:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStructNew,currp);
    pSVar53 = Expression::cast<wasm::StructNew>(this);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pSVar53 + 0x10));
    cast_65._4_4_ = (int)sVar83;
    while (cast_65._4_4_ = cast_65._4_4_ + -1, -1 < cast_65._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pSVar53 + 0x10),(long)cast_65._4_4_);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar84);
    }
    break;
  case (Expression)0x42:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStructGet,currp);
    pSVar54 = Expression::cast<wasm::StructGet>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar54 + 0x18));
    break;
  case (Expression)0x43:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStructSet,currp);
    pSVar55 = Expression::cast<wasm::StructSet>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar55 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar55 + 0x18));
    break;
  case (Expression)0x44:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStructRMW,currp);
    pSVar56 = Expression::cast<wasm::StructRMW>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar56 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar56 + 0x18));
    break;
  case (Expression)0x45:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStructCmpxchg,currp);
    pSVar57 = Expression::cast<wasm::StructCmpxchg>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar57 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar57 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar57 + 0x18));
    break;
  case (Expression)0x46:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayNew,currp);
    pAVar58 = Expression::cast<wasm::ArrayNew>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar58 + 0x18));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::maybePushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar58 + 0x10));
    break;
  case (Expression)0x47:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayNewData,currp);
    pAVar59 = Expression::cast<wasm::ArrayNewData>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar59 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar59 + 0x20));
    break;
  case (Expression)0x48:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayNewElem,currp);
    pAVar60 = Expression::cast<wasm::ArrayNewElem>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar60 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar60 + 0x20));
    break;
  case (Expression)0x49:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayNewFixed,currp);
    pAVar61 = Expression::cast<wasm::ArrayNewFixed>(this);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pAVar61 + 0x10));
    cast_73._4_4_ = (int)sVar83;
    while (cast_73._4_4_ = cast_73._4_4_ + -1, -1 < cast_73._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pAVar61 + 0x10),(long)cast_73._4_4_);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar84);
    }
    break;
  case (Expression)0x4a:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayGet,currp);
    pAVar62 = Expression::cast<wasm::ArrayGet>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar62 + 0x18));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar62 + 0x10));
    break;
  case (Expression)0x4b:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArraySet,currp);
    pAVar63 = Expression::cast<wasm::ArraySet>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar63 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar63 + 0x18));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar63 + 0x10));
    break;
  case (Expression)0x4c:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayLen,currp);
    pAVar64 = Expression::cast<wasm::ArrayLen>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar64 + 0x10));
    break;
  case (Expression)0x4d:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayCopy,currp);
    pAVar65 = Expression::cast<wasm::ArrayCopy>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar65 + 0x30));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar65 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar65 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar65 + 0x18));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar65 + 0x10));
    break;
  case (Expression)0x4e:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayFill,currp);
    pAVar66 = Expression::cast<wasm::ArrayFill>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar66 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar66 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar66 + 0x18));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar66 + 0x10));
    break;
  case (Expression)0x4f:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayInitData,currp);
    pAVar67 = Expression::cast<wasm::ArrayInitData>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar67 + 0x38));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar67 + 0x30));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar67 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar67 + 0x20));
    break;
  case (Expression)0x50:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayInitElem,currp);
    pAVar68 = Expression::cast<wasm::ArrayInitElem>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar68 + 0x38));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar68 + 0x30));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar68 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar68 + 0x20));
    break;
  case (Expression)0x51:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefAs,currp);
    pRVar69 = Expression::cast<wasm::RefAs>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pRVar69 + 0x18));
    break;
  case (Expression)0x52:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringNew,currp);
    pSVar70 = Expression::cast<wasm::StringNew>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::maybePushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar70 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::maybePushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar70 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar70 + 0x18));
    break;
  case (Expression)0x53:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringConst,currp);
    Expression::cast<wasm::StringConst>(this);
    break;
  case (Expression)0x54:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringMeasure,currp);
    pSVar71 = Expression::cast<wasm::StringMeasure>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar71 + 0x18));
    break;
  case (Expression)0x55:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringEncode,currp);
    pSVar72 = Expression::cast<wasm::StringEncode>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::maybePushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar72 + 0x28));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar72 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar72 + 0x18));
    break;
  case (Expression)0x56:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringConcat,currp);
    pSVar73 = Expression::cast<wasm::StringConcat>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar73 + 0x18));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar73 + 0x10));
    break;
  case (Expression)0x57:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringEq,currp);
    pSVar74 = Expression::cast<wasm::StringEq>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar74 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar74 + 0x18));
    break;
  case (Expression)0x58:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringWTF16Get,currp);
    pSVar75 = Expression::cast<wasm::StringWTF16Get>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar75 + 0x18));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar75 + 0x10));
    break;
  case (Expression)0x59:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringSliceWTF,currp);
    pSVar76 = Expression::cast<wasm::StringSliceWTF>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar76 + 0x20));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar76 + 0x18));
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar76 + 0x10));
    break;
  case (Expression)0x5a:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitContNew,currp);
    pCVar77 = Expression::cast<wasm::ContNew>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pCVar77 + 0x10));
    break;
  case (Expression)0x5b:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitContBind,currp);
    pCVar78 = Expression::cast<wasm::ContBind>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pCVar78 + 0x30));
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pCVar78 + 0x10));
    cast_91._4_4_ = (int)sVar83;
    while (cast_91._4_4_ = cast_91._4_4_ + -1, -1 < cast_91._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pCVar78 + 0x10),(long)cast_91._4_4_);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar84);
    }
    break;
  case (Expression)0x5c:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSuspend,currp);
    pSVar79 = Expression::cast<wasm::Suspend>(this);
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pSVar79 + 0x20));
    cast_92._4_4_ = (int)sVar83;
    while (cast_92._4_4_ = cast_92._4_4_ + -1, -1 < cast_92._4_4_) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pSVar79 + 0x20),(long)cast_92._4_4_);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar84);
    }
    break;
  case (Expression)0x5d:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitResume,currp);
    pRVar80 = Expression::cast<wasm::Resume>(this);
    for (i_20 = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type> *)(pRVar80 + 0x78)
                           ), i_20 < sVar83; i_20 = i_20 + 1) {
    }
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pRVar80 + 0x70));
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pRVar80 + 0x50));
    i_21 = (Index)sVar83;
    while (i_21 = i_21 - 1, -1 < (int)i_21) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pRVar80 + 0x50),(long)(int)i_21);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar84);
    }
    for (cast_93._4_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar80 + 0x30)
                           ), cast_93._4_4_ < sVar83; cast_93._4_4_ = cast_93._4_4_ + 1) {
    }
    for (cast_93._0_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar80 + 0x10)
                           ), (uint)cast_93 < sVar83; cast_93._0_4_ = (uint)cast_93 + 1) {
    }
    break;
  case (Expression)0x5e:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitResumeThrow,currp);
    pRVar81 = Expression::cast<wasm::ResumeThrow>(this);
    for (i_24 = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type> *)(pRVar81 + 0x88)
                           ), i_24 < sVar83; i_24 = i_24 + 1) {
    }
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pRVar81 + 0x80));
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pRVar81 + 0x60));
    i_25 = (Index)sVar83;
    while (i_25 = i_25 - 1, -1 < (int)i_25) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pRVar81 + 0x60),(long)(int)i_25);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar84);
    }
    for (cast_94._4_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar81 + 0x40)
                           ), cast_94._4_4_ < sVar83; cast_94._4_4_ = cast_94._4_4_ + 1) {
    }
    for (cast_94._0_4_ = 0;
        sVar83 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar81 + 0x20)
                           ), (uint)cast_94 < sVar83; cast_94._0_4_ = (uint)cast_94 + 1) {
    }
    break;
  case (Expression)0x5f:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStackSwitch,currp);
    pSVar82 = Expression::cast<wasm::StackSwitch>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar82 + 0x40));
    sVar83 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pSVar82 + 0x20));
    local_3b4 = (int)sVar83;
    while (local_3b4 = local_3b4 + -1, -1 < local_3b4) {
      ppEVar84 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pSVar82 + 0x20),(long)local_3b4);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar84);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }